

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void YUY2ToYRow_SSE2(uint8_t *src_yuy2,uint8_t *dst_y,int width)

{
  undefined1 (*pauVar1) [16];
  bool bVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  undefined1 auVar19 [16];
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  do {
    auVar21 = *(undefined1 (*) [16])src_yuy2;
    pauVar1 = (undefined1 (*) [16])((long)src_yuy2 + 0x10);
    src_yuy2 = (uint8_t *)((long)src_yuy2 + 0x20);
    auVar19[8] = 0xff;
    auVar19._0_8_ = 0xff00ff00ff00ff;
    auVar19[9] = 0;
    auVar19[10] = 0xff;
    auVar19[0xb] = 0;
    auVar19[0xc] = 0xff;
    auVar19[0xd] = 0;
    auVar19[0xe] = 0xff;
    auVar19[0xf] = 0;
    auVar21 = auVar21 & auVar19;
    auVar22[8] = 0xff;
    auVar22._0_8_ = 0xff00ff00ff00ff;
    auVar22[9] = 0;
    auVar22[10] = 0xff;
    auVar22[0xb] = 0;
    auVar22[0xc] = 0xff;
    auVar22[0xd] = 0;
    auVar22[0xe] = 0xff;
    auVar22[0xf] = 0;
    auVar22 = *pauVar1 & auVar22;
    uVar3 = auVar21._0_2_;
    uVar4 = auVar21._2_2_;
    uVar5 = auVar21._4_2_;
    uVar6 = auVar21._6_2_;
    sVar7 = auVar21._8_2_;
    sVar8 = auVar21._10_2_;
    sVar9 = auVar21._12_2_;
    sVar10 = auVar21._14_2_;
    uVar11 = auVar22._0_2_;
    uVar12 = auVar22._2_2_;
    uVar13 = auVar22._4_2_;
    uVar14 = auVar22._6_2_;
    sVar15 = auVar22._8_2_;
    sVar16 = auVar22._10_2_;
    sVar17 = auVar22._12_2_;
    sVar18 = auVar22._14_2_;
    *dst_y = (uVar3 != 0) * (uVar3 < 0x100) * auVar21[0] - (0xff < uVar3);
    dst_y[1] = (uVar4 != 0) * (uVar4 < 0x100) * auVar21[2] - (0xff < uVar4);
    dst_y[2] = (uVar5 != 0) * (uVar5 < 0x100) * auVar21[4] - (0xff < uVar5);
    dst_y[3] = (uVar6 != 0) * (uVar6 < 0x100) * auVar21[6] - (0xff < uVar6);
    dst_y[4] = (0 < sVar7) * (sVar7 < 0x100) * auVar21[8] - (0xff < sVar7);
    dst_y[5] = (0 < sVar8) * (sVar8 < 0x100) * auVar21[10] - (0xff < sVar8);
    dst_y[6] = (0 < sVar9) * (sVar9 < 0x100) * auVar21[0xc] - (0xff < sVar9);
    dst_y[7] = (0 < sVar10) * (sVar10 < 0x100) * auVar21[0xe] - (0xff < sVar10);
    dst_y[8] = (uVar11 != 0) * (uVar11 < 0x100) * auVar22[0] - (0xff < uVar11);
    dst_y[9] = (uVar12 != 0) * (uVar12 < 0x100) * auVar22[2] - (0xff < uVar12);
    dst_y[10] = (uVar13 != 0) * (uVar13 < 0x100) * auVar22[4] - (0xff < uVar13);
    dst_y[0xb] = (uVar14 != 0) * (uVar14 < 0x100) * auVar22[6] - (0xff < uVar14);
    dst_y[0xc] = (0 < sVar15) * (sVar15 < 0x100) * auVar22[8] - (0xff < sVar15);
    dst_y[0xd] = (0 < sVar16) * (sVar16 < 0x100) * auVar22[10] - (0xff < sVar16);
    dst_y[0xe] = (0 < sVar17) * (sVar17 < 0x100) * auVar22[0xc] - (0xff < sVar17);
    dst_y[0xf] = (0 < sVar18) * (sVar18 < 0x100) * auVar22[0xe] - (0xff < sVar18);
    dst_y = dst_y + 0x10;
    iVar20 = width + -0x10;
    bVar2 = 0xf < width;
    width = iVar20;
  } while (iVar20 != 0 && bVar2);
  return;
}

Assistant:

void YUY2ToYRow_SSE2(const uint8_t* src_yuy2, uint8_t* dst_y, int width) {
  asm volatile(
      "pcmpeqb     %%xmm5,%%xmm5                 \n"
      "psrlw       $0x8,%%xmm5                   \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "lea         0x20(%0),%0                   \n"
      "pand        %%xmm5,%%xmm0                 \n"
      "pand        %%xmm5,%%xmm1                 \n"
      "packuswb    %%xmm1,%%xmm0                 \n"
      "movdqu      %%xmm0,(%1)                   \n"
      "lea         0x10(%1),%1                   \n"
      "sub         $0x10,%2                      \n"
      "jg          1b                            \n"
      : "+r"(src_yuy2),  // %0
        "+r"(dst_y),     // %1
        "+r"(width)      // %2
      :
      : "memory", "cc", "xmm0", "xmm1", "xmm5");
}